

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  pointer pbVar1;
  string *psVar2;
  size_t __n;
  pointer pcVar3;
  FileDescriptorTables *pFVar4;
  int iVar5;
  const_iterator cVar6;
  FileDescriptor *pFVar7;
  long lVar8;
  size_type *psVar9;
  DescriptorPool *this_00;
  long lVar10;
  Tables *this_01;
  bool bVar11;
  FileDescriptorProto existing_proto;
  string local_148;
  string local_128;
  FileDescriptorProto local_108;
  
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  local_108.super_Message.super_MessageLite._vptr_MessageLite =
       (MessageLite)(this->filename_)._M_dataplus._M_p;
  cVar6 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->tables_->files_by_name_)._M_h,(key_type *)&local_108);
  if ((cVar6.
       super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
       ._M_cur != (__node_type *)0x0) &&
     (pFVar7 = *(FileDescriptor **)
                ((long)cVar6.
                       super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                       ._M_cur + 0x10), pFVar7 != (FileDescriptor *)0x0)) {
    FileDescriptorProto::FileDescriptorProto(&local_108);
    FileDescriptor::CopyTo(pFVar7,&local_108);
    if ((*(int *)(pFVar7 + 0x3c) == 2) && (((proto->_has_bits_).has_bits_[0] & 4) != 0)) {
      local_108._has_bits_.has_bits_[0]._0_1_ = (byte)local_108._has_bits_.has_bits_[0] | 4;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"proto2","");
      if (((ulong)local_108._internal_metadata_.
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        local_108._internal_metadata_.
        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
        .ptr_ = *(InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  *)(((ulong)local_108._internal_metadata_.
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             .ptr_ & 0xfffffffffffffffe) + 0x18);
      }
      if (local_108.syntax_.ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (&local_108.syntax_,
                   (Arena *)local_108._internal_metadata_.
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_,&local_148);
      }
      else {
        std::__cxx11::string::_M_assign((string *)local_108.syntax_.ptr_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
    }
    MessageLite::SerializeAsString_abi_cxx11_(&local_148,(MessageLite *)&local_108);
    MessageLite::SerializeAsString_abi_cxx11_(&local_128,(MessageLite *)proto);
    if (local_148._M_string_length == local_128._M_string_length) {
      if (local_148._M_string_length == 0) {
        bVar11 = true;
      }
      else {
        iVar5 = bcmp(local_148._M_dataplus._M_p,local_128._M_dataplus._M_p,
                     local_148._M_string_length);
        bVar11 = iVar5 == 0;
      }
    }
    else {
      bVar11 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    FileDescriptorProto::~FileDescriptorProto(&local_108);
    if (bVar11) {
      return pFVar7;
    }
  }
  this_01 = this->tables_;
  pbVar1 = (this_01->pending_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this_01->pending_files_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 5;
    psVar2 = (proto->name_).ptr_;
    __n = psVar2->_M_string_length;
    psVar9 = &pbVar1->_M_string_length;
    lVar10 = 0;
    do {
      if ((*psVar9 == __n) &&
         ((__n == 0 ||
          (iVar5 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar9 + -1))->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,__n),
          iVar5 == 0)))) {
        AddRecursiveImportError(this,proto,(int)lVar10);
        goto LAB_00323790;
      }
      lVar10 = lVar10 + 1;
      psVar9 = psVar9 + 4;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
  }
  if ((this->pool_->lazily_build_dependencies_ == false) &&
     (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this_01->pending_files_,(proto->name_).ptr_);
    if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      lVar8 = 0;
      do {
        local_108.super_Message.super_MessageLite._vptr_MessageLite =
             *((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar8];
        cVar6 = std::
                _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->tables_->files_by_name_)._M_h,(key_type *)&local_108);
        if ((cVar6.
             super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
             ._M_cur == (__node_type *)0x0) ||
           (*(long *)((long)cVar6.
                            super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                            ._M_cur + 0x10) == 0)) {
          this_00 = this->pool_;
          if (this_00->underlay_ != (DescriptorPool *)0x0) {
            pFVar7 = DescriptorPool::FindFileByName
                               (this_00->underlay_,
                                (string *)
                                ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements
                                [lVar8]);
            if (pFVar7 != (FileDescriptor *)0x0) goto LAB_003236ff;
            this_00 = this->pool_;
          }
          DescriptorPool::TryFindFileInFallbackDatabase
                    (this_00,(string *)
                             ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar8]
                    );
        }
LAB_003236ff:
        lVar8 = lVar8 + 1;
      } while (lVar8 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    this_01 = this->tables_;
    pbVar1 = (this_01->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this_01->pending_files_).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
    pcVar3 = pbVar1[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar1[-1].field_2) {
      operator_delete(pcVar3);
      this_01 = this->tables_;
    }
  }
  DescriptorPool::Tables::AddCheckpoint(this_01);
  pFVar7 = BuildFileImpl(this,proto);
  pFVar4 = this->file_tables_;
  std::
  unique_ptr<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ::operator=(&pFVar4->fields_by_lowercase_name_tmp_,proto);
  std::
  unique_ptr<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ::operator=(&pFVar4->fields_by_camelcase_name_tmp_,proto);
  if (pFVar7 == (FileDescriptor *)0x0) {
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
LAB_00323790:
    pFVar7 = (FileDescriptor *)0x0;
  }
  else {
    DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
    pFVar7[0x41] = (FileDescriptor)0x1;
  }
  return pFVar7;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file, proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (int i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = BuildFileImpl(proto);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
  } else {
    tables_->RollbackToLastCheckpoint();
  }

  return result;
}